

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O2

int Prs_ManReadRange(Prs_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 in_RCX;
  undefined8 uVar5;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  char *pcVar6;
  char cVar7;
  
  if (*p->pCur != '[') {
    __assert_fail("Prs_ManIsChar(p, \'[\')",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                  ,0x20b,"int Prs_ManReadRange(Prs_Man_t *)");
  }
  p->pCur = p->pCur + 1;
  iVar1 = Prs_ManUtilSkipSpaces(p);
  iVar3 = extraout_EDX;
  if (iVar1 != 0) {
    pcVar6 = "Error number 3.";
    goto LAB_0035a201;
  }
  pcVar6 = p->pCur;
  cVar7 = *pcVar6;
  if ((byte)(cVar7 - 0x3aU) < 0xf6) {
LAB_0035a1c5:
    pcVar6 = "Cannot read digit in range specification.";
  }
  else {
    iVar1 = atoi(pcVar6);
    while (pcVar6 = pcVar6 + 1, 0xf5 < (byte)(cVar7 - 0x3aU)) {
      p->pCur = pcVar6;
      cVar7 = *pcVar6;
    }
    iVar2 = Prs_ManUtilSkipSpaces(p);
    iVar3 = extraout_EDX_00;
    if (iVar2 != 0) {
      pcVar6 = "Error number 4.";
      goto LAB_0035a201;
    }
    pcVar6 = p->pCur;
    uVar5 = CONCAT71((int7)((ulong)in_RCX >> 8),*pcVar6);
    iVar4 = (int)uVar5;
    iVar2 = iVar1;
    if (*pcVar6 == ':') {
      p->pCur = pcVar6 + 1;
      iVar2 = Prs_ManUtilSkipSpaces(p);
      iVar3 = extraout_EDX_01;
      if (iVar2 != 0) {
        pcVar6 = "Error number 5.";
        goto LAB_0035a201;
      }
      pcVar6 = p->pCur;
      cVar7 = *pcVar6;
      if ((byte)(cVar7 - 0x3aU) < 0xf6) goto LAB_0035a1c5;
      iVar2 = atoi(pcVar6);
      while (pcVar6 = pcVar6 + 1, 0xf5 < (byte)(cVar7 - 0x3aU)) {
        p->pCur = pcVar6;
        cVar7 = *pcVar6;
      }
      iVar4 = Prs_ManUtilSkipSpaces(p);
      iVar3 = extraout_EDX_03;
      if (iVar4 != 0) {
        pcVar6 = "Error number 6.";
        goto LAB_0035a201;
      }
      pcVar6 = p->pCur;
      iVar4 = (int)CONCAT71((int7)((ulong)uVar5 >> 8),*pcVar6);
    }
    if ((char)iVar4 == ']') {
      p->pCur = pcVar6 + 1;
      iVar3 = Prs_ManUtilSkipSpaces(p);
      if (iVar3 == 0) {
        iVar3 = Hash_Int2ManInsert(p->vHash,iVar1,iVar2,iVar4);
        return iVar3;
      }
      pcVar6 = "Error number 6a.";
      iVar3 = extraout_EDX_02;
    }
    else {
      pcVar6 = "Cannot read closing brace in range specification.";
    }
  }
LAB_0035a201:
  Prs_ManErrorSet(p,pcVar6,iVar3);
  return 0;
}

Assistant:

static inline int Prs_ManReadRange( Prs_Man_t * p )
{
    int Left, Right;
    assert( Prs_ManIsChar(p, '[') );
    p->pCur++;
    if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 3.", 0);
    if ( !Prs_ManIsDigit(p) )               return Prs_ManErrorSet(p, "Cannot read digit in range specification.", 0);
    Left = Right = atoi(p->pCur);
    while ( Prs_ManIsDigit(p) ) 
        p->pCur++;
    if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 4.", 0);
    if ( Prs_ManIsChar(p, ':') )
    {
        p->pCur++;
        if ( Prs_ManUtilSkipSpaces(p) )     return Prs_ManErrorSet(p, "Error number 5.", 0);
        if ( !Prs_ManIsDigit(p) )           return Prs_ManErrorSet(p, "Cannot read digit in range specification.", 0);
        Right = atoi(p->pCur);
        while ( Prs_ManIsDigit(p) ) 
            p->pCur++;
        if ( Prs_ManUtilSkipSpaces(p) )     return Prs_ManErrorSet(p, "Error number 6.", 0);
    }
    if ( !Prs_ManIsChar(p, ']') )           return Prs_ManErrorSet(p, "Cannot read closing brace in range specification.", 0);
    p->pCur++;
    if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 6a.", 0);
    return Hash_Int2ManInsert( p->vHash, Left, Right, 0 );
}